

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O3

void __thiscall MeshDenoisingViaL0Minimization::initParameters(MeshDenoisingViaL0Minimization *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  ParameterSet *pPVar3;
  MeshDenoisingViaL0Minimization *this_00;
  double dVar4;
  undefined1 local_278 [8];
  TriMesh mesh;
  string local_40;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
  puVar2 = &mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .field_0x8;
  local_278 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"mu_beta","");
  ParameterSet::addParameter(pPVar3,(string *)local_278,1.414);
  if (local_278 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_278);
  }
  pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
  local_278 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"beta","");
  ParameterSet::addParameter(pPVar3,(string *)local_278,0.001);
  if (local_278 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_278);
  }
  pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
  local_278 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"beta_max","");
  ParameterSet::addParameter(pPVar3,(string *)local_278,1000.0);
  if (local_278 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_278);
  }
  pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
  local_278 = (undefined1  [8])puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"mu_alpha","");
  ParameterSet::addParameter(pPVar3,(string *)local_278,0.5);
  if (local_278 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_278);
  }
  DataManager::getNoisyMesh((TriMesh *)local_278,(this->super_MeshDenoisingBase).data_manager_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ ==
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"alpha","");
    ParameterSet::addParameter(pPVar3,&local_40,0.0001);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"lambda","");
    ParameterSet::addParameter(pPVar3,&local_40,0.0001);
  }
  else {
    this_00 = this;
    mesh.super_Mesh.
    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
    .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
    _544_8_ = MeshDenoisingBase::getAverageEdgeLength
                        (&this->super_MeshDenoisingBase,(TriMesh *)local_278);
    dVar4 = getAverageDihedralAngle(this_00,(TriMesh *)local_278);
    pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"alpha","");
    ParameterSet::addParameter(pPVar3,&local_40,dVar4 * 0.1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"lambda","");
    ParameterSet::addParameter
              (pPVar3,&local_40,
               (double)mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ * 0.2 *
               (double)mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ * dVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_278);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("mu_beta"), 1.414);
    parameter_set_->addParameter(string("beta"), 0.001);
    parameter_set_->addParameter(string("beta_max"), 1000.0);
    parameter_set_->addParameter(string("mu_alpha"), 0.5);

    TriMesh mesh = data_manager_->getNoisyMesh();
    if(mesh.n_vertices() == 0)
    {
        parameter_set_->addParameter(string("alpha"), 0.0001);
        parameter_set_->addParameter(string("lambda"), 0.0001);
    }
    else
    {
        double mean_edge_length = getAverageEdgeLength(mesh);
        double mean_dihedral_angle = getAverageDihedralAngle(mesh);
        parameter_set_->addParameter(string("alpha"), 0.1 * mean_dihedral_angle);
        parameter_set_->addParameter(string("lambda"), 0.2 * mean_edge_length * mean_edge_length * mean_dihedral_angle);
    }

}